

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

void lyxml_ns_rm_all(lyxml_ctx *xmlctx)

{
  lyd_node *__ptr;
  ulong uVar1;
  
  if ((xmlctx->ns).count != 0) {
    uVar1 = 0;
    do {
      __ptr = (xmlctx->ns).field_2.dnodes[uVar1];
      free(*(void **)__ptr);
      free(__ptr->schema);
      free(__ptr);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (xmlctx->ns).count);
  }
  ly_set_erase(&xmlctx->ns,(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

static void
lyxml_ns_rm_all(struct lyxml_ctx *xmlctx)
{
    struct lyxml_ns *ns;
    uint32_t i;

    for (i = 0; i < xmlctx->ns.count; ++i) {
        ns = xmlctx->ns.objs[i];

        free(ns->prefix);
        free(ns->uri);
        free(ns);
    }
    ly_set_erase(&xmlctx->ns, NULL);
}